

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rectlight.cpp
# Opt level: O2

double __thiscall RectLight::getShadowRatio(RectLight *this,Scene *scene,Vector3 *p)

{
  int iVar1;
  int iVar2;
  pointer ppOVar3;
  double dVar4;
  double dVar5;
  int local_13c;
  double local_138;
  double x;
  Vector3 local_f8;
  Vector3 dir;
  Vector3 c;
  Collision coll;
  
  local_13c = 0x10;
  iVar1 = 0;
  local_138 = 0.0;
  do {
    if (iVar1 == 4) {
      return (double)local_13c * 0.25 * 0.25;
    }
    dVar4 = 0.0;
    for (iVar2 = 0; iVar2 != 4; iVar2 = iVar2 + 1) {
      Vector3::operator*(&dir,&this->m_dx,(local_138 + 0.5 + local_138 + 0.5) * 0.25 + -1.0);
      operator+(&this->m_o,&dir);
      Vector3::operator*(&local_f8,&this->m_dy,(dVar4 + 0.5 + dVar4 + 0.5) * 0.25 + -1.0);
      operator+((Vector3 *)&coll,&local_f8);
      operator-(&c,p);
      dVar5 = Vector3::mod(&dir);
      for (ppOVar3 = (scene->m_objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ppOVar3 !=
          (scene->m_objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
          super__Vector_impl_data._M_finish; ppOVar3 = ppOVar3 + 1) {
        (*(*ppOVar3)->_vptr_Object[2])(&coll,*ppOVar3,p,&dir);
        if ((coll.dist < 1000000000.0) && (coll.dist + 1e-06 < dVar5)) {
          local_13c = local_13c + -1;
          break;
        }
      }
      dVar4 = dVar4 + 1.0;
    }
    local_138 = local_138 + 1.0;
    iVar1 = iVar1 + 1;
  } while( true );
}

Assistant:

double RectLight::getShadowRatio(const Scene* scene, const Vector3& p) const
{
    int ret = SHADOW_SAMPLE * SHADOW_SAMPLE;
    for (int i = 0; i < SHADOW_SAMPLE; i++)
        for (int j = 0; j < SHADOW_SAMPLE; j++)
        {
            double x = (i + 0.5) * 2 / SHADOW_SAMPLE - 1,
                   y = (j + 0.5) * 2 / SHADOW_SAMPLE - 1;
            Vector3 c = m_o + m_dx * x + m_dy * y, dir = c - p;
            double dist = dir.mod();

            for (auto o = scene->objectsBegin(); o != scene->objectsEnd(); o++)
            {
                Collision coll = (*o)->collide(p, dir);
                if (coll.isHit() && coll.dist + Const::EPS < dist)
                {
                    ret--;
                    break;
                }
            }
        }
    return 1.0 * ret / SHADOW_SAMPLE / SHADOW_SAMPLE;
}